

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O2

int Fax3Decode1D(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uint32_t lastx;
  uint8_t *puVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t *puVar7;
  byte bVar8;
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint uVar12;
  char *pcVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  int iVar17;
  int iVar18;
  uint32_t a0;
  uint32_t *puVar19;
  bool bVar20;
  uint32_t local_78;
  uint32_t *local_60;
  
  puVar2 = tif->tif_data;
  if (occ % *(long *)(puVar2 + 8) != 0) {
    TIFFErrorExtR(tif,"Fax3Decode1D","Fractional scanlines cannot be read");
    return -1;
  }
  lastx = *(uint32_t *)(puVar2 + 0x10);
  lVar3 = *(long *)(puVar2 + 0x40);
  uVar12 = *(uint *)(puVar2 + 0x48);
  iVar9 = *(int *)(puVar2 + 0x4c);
  iVar18 = *(int *)(puVar2 + 0x50);
  pbVar15 = tif->tif_rawcp;
  pbVar14 = pbVar15 + tif->tif_rawcc;
  puVar7 = *(uint32_t **)(puVar2 + 0x78);
LAB_00257528:
  if (occ < 1) {
    *(int *)(puVar2 + 0x4c) = iVar9;
    *(uint *)(puVar2 + 0x48) = uVar12;
    *(int *)(puVar2 + 0x50) = iVar18;
    tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar15));
    tif->tif_rawcp = pbVar15;
    return 1;
  }
  pbVar16 = pbVar15;
  iVar17 = iVar9;
  local_60 = puVar7;
  if (iVar18 == 0) {
    while( true ) {
      pbVar15 = pbVar16;
      iVar17 = iVar9;
      if (iVar9 < 0xb) {
        if (pbVar16 < pbVar14) {
          pbVar15 = pbVar16 + 1;
          uVar12 = uVar12 | (uint)*(byte *)(lVar3 + (ulong)*pbVar16) << ((byte)iVar9 & 0x1f);
          iVar17 = iVar9 + 8;
          if ((iVar9 < 3) && (iVar17 = 0xb, pbVar15 < pbVar14)) {
            uVar12 = uVar12 | (uint)*(byte *)(lVar3 + (ulong)pbVar16[1]) <<
                              ((byte)(iVar9 + 8) & 0x1f);
            pbVar15 = pbVar16 + 2;
            iVar17 = iVar9 + 0x10;
          }
        }
        else {
          iVar17 = 0xb;
          if (iVar9 == 0) {
            iVar18 = 0;
            goto LAB_002579aa;
          }
        }
      }
      if ((uVar12 & 0x7ff) == 0) break;
      iVar9 = iVar17 + -1;
      uVar12 = uVar12 >> 1;
      pbVar16 = pbVar15;
    }
  }
  while( true ) {
    uVar5 = uVar12;
    if (iVar17 < 8) {
      if (pbVar15 < pbVar14) {
        bVar1 = *pbVar15;
        bVar8 = (byte)iVar17;
        pbVar15 = pbVar15 + 1;
        iVar17 = iVar17 + 8;
        uVar5 = uVar12 | (uint)*(byte *)(lVar3 + (ulong)bVar1) << (bVar8 & 0x1f);
      }
      else {
        bVar20 = iVar17 == 0;
        iVar17 = 8;
        pbVar16 = pbVar15;
        if (bVar20) goto LAB_002579aa;
      }
    }
    if ((char)uVar5 != '\0') break;
    uVar12 = uVar5 >> 8;
    iVar17 = iVar17 + -8;
  }
  do {
    iVar17 = iVar17 + -1;
    uVar12 = uVar5 >> 1;
    uVar4 = uVar5 & 1;
    uVar5 = uVar12;
  } while (uVar4 == 0);
  a0 = 0;
LAB_00257617:
  local_78 = 0;
  pbVar16 = pbVar15;
  do {
    pbVar15 = pbVar16;
    iVar9 = iVar17;
    puVar19 = local_60;
    if (iVar17 < 0xc) {
      if (pbVar16 < pbVar14) {
        pbVar15 = pbVar16 + 1;
        uVar12 = uVar12 | (uint)*(byte *)(lVar3 + (ulong)*pbVar16) << ((byte)iVar17 & 0x1f);
        iVar9 = iVar17 + 8;
        if ((iVar17 < 4) && (iVar9 = 0xc, pbVar15 < pbVar14)) {
          uVar12 = uVar12 | (uint)*(byte *)(lVar3 + (ulong)pbVar16[1]) <<
                            ((byte)(iVar17 + 8) & 0x1f);
          pbVar15 = pbVar16 + 2;
          iVar9 = iVar17 + 0x10;
        }
      }
      else {
        iVar9 = 0xc;
        if (iVar17 == 0) goto LAB_00257abe;
      }
    }
    uVar5 = uVar12 & 0xfff;
    uVar12 = uVar12 >> (TIFFFaxWhiteTable[uVar5].Width & 0x1f);
    iVar17 = iVar9 - (uint)TIFFFaxWhiteTable[uVar5].Width;
    pbVar16 = pbVar15;
    switch(TIFFFaxWhiteTable[uVar5].State) {
    case '\a':
      goto switchD_002576b8_caseD_7;
    default:
      goto LAB_00257803;
    case '\t':
    case '\v':
      a0 = a0 + TIFFFaxWhiteTable[uVar5].Param;
      local_78 = local_78 + TIFFFaxWhiteTable[uVar5].Param;
      break;
    case '\f':
      iVar18 = 1;
      goto LAB_00257846;
    }
  } while( true );
switchD_002576b8_caseD_7:
  if (local_60 < puVar7 + *(uint *)(puVar2 + 0x68)) {
    uVar10 = TIFFFaxWhiteTable[uVar5].Param;
    uVar11 = local_78 + uVar10;
    puVar19 = local_60 + 1;
    *local_60 = uVar11;
    a0 = a0 + uVar10;
    if ((int)lastx <= (int)a0) goto LAB_00257872;
    local_78 = 0;
    while( true ) {
      pbVar15 = pbVar16;
      iVar9 = iVar17;
      if (iVar17 < 0xd) {
        if (pbVar16 < pbVar14) {
          pbVar15 = pbVar16 + 1;
          uVar12 = uVar12 | (uint)*(byte *)(lVar3 + (ulong)*pbVar16) << ((byte)iVar17 & 0x1f);
          iVar9 = iVar17 + 8;
          if (iVar17 < 5) {
            if (pbVar15 < pbVar14) {
              uVar12 = uVar12 | (uint)*(byte *)(lVar3 + (ulong)pbVar16[1]) << ((byte)iVar9 & 0x1f);
              iVar9 = iVar17 + 0x10;
              pbVar15 = pbVar16 + 2;
            }
            else {
              iVar9 = 0xd;
            }
          }
        }
        else {
          iVar9 = 0xd;
          if (iVar17 == 0) goto LAB_00257abe;
        }
      }
      uVar5 = uVar12 & 0x1fff;
      uVar12 = uVar12 >> (TIFFFaxBlackTable[uVar5].Width & 0x1f);
      iVar17 = iVar9 - (uint)TIFFFaxBlackTable[uVar5].Width;
      bVar1 = TIFFFaxBlackTable[uVar5].State;
      if (1 < bVar1 - 10) break;
      a0 = a0 + TIFFFaxBlackTable[uVar5].Param;
      local_78 = local_78 + TIFFFaxBlackTable[uVar5].Param;
      pbVar16 = pbVar15;
    }
    if (bVar1 == 0xc) {
      iVar18 = 1;
LAB_00257846:
      iVar9 = iVar17;
      if (local_78 == 0) goto LAB_0025787e;
      if (puVar7 + *(uint *)(puVar2 + 0x68) <= puVar19) goto LAB_00257cf2;
      *puVar19 = local_78;
      puVar19 = puVar19 + 1;
      goto LAB_0025787e;
    }
    if (bVar1 != 8) {
LAB_00257803:
      Fax3Unexpected("Fax3Decode1D",tif,*(uint32_t *)(puVar2 + 0x98),a0);
      iVar18 = 0;
      goto LAB_00257846;
    }
    if (puVar19 < puVar7 + *(uint *)(puVar2 + 0x68)) {
      uVar10 = TIFFFaxBlackTable[uVar5].Param;
      local_78 = local_78 + uVar10;
      puVar19 = local_60 + 2;
      local_60[1] = local_78;
      a0 = a0 + uVar10;
      if ((int)lastx <= (int)a0) goto LAB_00257872;
      if (local_78 != 0 || uVar11 != 0) {
        local_60 = puVar19;
      }
      goto LAB_00257617;
    }
  }
  uVar12 = *(uint *)(puVar2 + 0x98);
LAB_00257c12:
  uVar6 = (ulong)uVar12;
  bVar20 = (tif->tif_flags >> 10 & 1) == 0;
  pcVar13 = "tile";
  if (bVar20) {
    pcVar13 = "strip";
  }
  puVar7 = &tif->tif_curtile;
  if (bVar20) {
    puVar7 = &tif->tif_curstrip;
  }
  uVar12 = *puVar7;
  goto LAB_00257cd9;
LAB_00257abe:
  local_60 = puVar19;
  Fax3PrematureEOF("Fax3Decode1D",tif,*(uint32_t *)(puVar2 + 0x98),a0);
  if (local_78 != 0) {
    if (puVar7 + *(uint *)(puVar2 + 0x68) <= local_60) {
      uVar12 = *(uint *)(puVar2 + 0x98);
      goto LAB_00257c12;
    }
    *local_60 = local_78;
    local_60 = local_60 + 1;
  }
  iVar18 = 0;
  if (a0 == lastx) goto LAB_00257b2c;
  Fax3BadLength("Fax3Decode1D",tif,*(uint32_t *)(puVar2 + 0x98),a0,lastx);
  uVar6 = (long)local_60 - (long)puVar7;
  for (; ((int)lastx < (int)a0 && (puVar7 < local_60)); local_60 = local_60 + -1) {
    a0 = a0 - local_60[-1];
    uVar6 = uVar6 - 4;
  }
  if ((int)a0 < (int)lastx) {
    uVar10 = 0;
    if (0 < (int)a0) {
      uVar10 = a0;
    }
    if ((uVar6 & 4) != 0) {
      if (puVar7 + *(uint *)(puVar2 + 0x68) <= local_60) goto LAB_00257c95;
      *local_60 = 0;
      local_60 = local_60 + 1;
    }
    if (local_60 < puVar7 + *(uint *)(puVar2 + 0x68)) {
      *local_60 = lastx - uVar10;
      iVar18 = 0;
      local_60 = local_60 + 1;
      goto LAB_00257b2c;
    }
    goto LAB_00257c95;
  }
  if ((int)a0 <= (int)lastx) goto LAB_00257b2c;
  iVar18 = 0;
  if (puVar7 + *(uint *)(puVar2 + 0x68) <= local_60) goto LAB_00257c95;
  goto LAB_00257c73;
LAB_00257872:
  iVar18 = 0;
  iVar9 = iVar17;
LAB_0025787e:
  if (a0 != lastx) {
    Fax3BadLength("Fax3Decode1D",tif,*(uint32_t *)(puVar2 + 0x98),a0,lastx);
    uVar6 = (long)puVar19 - (long)puVar7;
    for (; ((int)lastx < (int)a0 && (puVar7 < puVar19)); puVar19 = puVar19 + -1) {
      a0 = a0 - puVar19[-1];
      uVar6 = uVar6 - 4;
    }
    if ((int)lastx <= (int)a0) {
      if ((int)lastx < (int)a0) {
        if ((puVar7 + *(uint *)(puVar2 + 0x68) <= puVar19) ||
           (*puVar19 = lastx, puVar7 + *(uint *)(puVar2 + 0x68) <= puVar19 + 1)) {
          uVar6 = (ulong)*(uint *)(puVar2 + 0x98);
          goto LAB_00257c9c;
        }
        puVar19[1] = 0;
        puVar19 = puVar19 + 2;
      }
      goto LAB_00257964;
    }
    if ((int)a0 < 1) {
      a0 = 0;
    }
    if ((uVar6 & 4) != 0) {
      if (puVar7 + *(uint *)(puVar2 + 0x68) <= puVar19) goto LAB_00257cf2;
      *puVar19 = 0;
      puVar19 = puVar19 + 1;
    }
    if (puVar7 + *(uint *)(puVar2 + 0x68) <= puVar19) {
LAB_00257cf2:
      uVar6 = (ulong)*(uint *)(puVar2 + 0x98);
      goto LAB_00257c9c;
    }
    *puVar19 = lastx - a0;
    puVar19 = puVar19 + 1;
  }
LAB_00257964:
  (**(code **)(puVar2 + 0x58))(buf,puVar7,puVar19,lastx);
  buf = buf + *(long *)(puVar2 + 8);
  occ = occ - *(long *)(puVar2 + 8);
  *(int *)(puVar2 + 0x98) = *(int *)(puVar2 + 0x98) + 1;
  goto LAB_00257528;
LAB_002579aa:
  if (lastx == 0) goto LAB_00257b2c;
  uVar6 = 0;
  Fax3BadLength("Fax3Decode1D",tif,*(uint32_t *)(puVar2 + 0x98),0,lastx);
  iVar9 = 0;
  for (; ((int)lastx < iVar9 && (puVar7 < local_60)); local_60 = local_60 + -1) {
    iVar9 = iVar9 - local_60[-1];
    uVar6 = uVar6 - 4;
  }
  if (iVar9 < (int)lastx) {
    iVar17 = 0;
    if (0 < iVar9) {
      iVar17 = iVar9;
    }
    if ((uVar6 & 4) != 0) {
      if (puVar7 + *(uint *)(puVar2 + 0x68) <= local_60) goto LAB_00257c95;
      *local_60 = 0;
      local_60 = local_60 + 1;
    }
    if (puVar7 + *(uint *)(puVar2 + 0x68) <= local_60) goto LAB_00257c95;
    *local_60 = lastx - iVar17;
    local_60 = local_60 + 1;
    goto LAB_00257b2c;
  }
  if (iVar9 <= (int)lastx) goto LAB_00257b2c;
  if (puVar7 + *(uint *)(puVar2 + 0x68) <= local_60) goto LAB_00257c95;
LAB_00257c73:
  *local_60 = lastx;
  if (puVar7 + *(uint *)(puVar2 + 0x68) <= local_60 + 1) {
LAB_00257c95:
    uVar6 = (ulong)*(uint *)(puVar2 + 0x98);
LAB_00257c9c:
    bVar20 = (tif->tif_flags >> 10 & 1) == 0;
    pcVar13 = "tile";
    if (bVar20) {
      pcVar13 = "strip";
    }
    puVar7 = &tif->tif_curtile;
    if (bVar20) {
      puVar7 = &tif->tif_curstrip;
    }
    uVar12 = *puVar7;
LAB_00257cd9:
    TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",uVar6,pcVar13,
                  (ulong)uVar12);
    return -1;
  }
  local_60[1] = 0;
  local_60 = local_60 + 2;
LAB_00257b2c:
  (**(code **)(puVar2 + 0x58))(buf,puVar7,local_60,lastx);
  puVar2[0x4c] = '\0';
  puVar2[0x4d] = '\0';
  puVar2[0x4e] = '\0';
  puVar2[0x4f] = '\0';
  *(uint *)(puVar2 + 0x48) = uVar12;
  *(int *)(puVar2 + 0x50) = iVar18;
  tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar16));
  tif->tif_rawcp = pbVar16;
  return -1;
}

Assistant:

static int Fax3Decode1D(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE(tif, sp, "Fax3Decode1D");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    thisrun = sp->curruns;
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %" PRIu32 "\n", tif->tif_row);
        fflush(stdout);
#endif
        SYNC_EOL(EOF1D);
        EXPAND1D(EOF1Da);
        (*sp->fill)(buf, thisrun, pa, lastx);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOF1D: /* premature EOF */
        CLEANUP_RUNS();
    EOF1Da: /* premature EOF */
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (-1);
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}